

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_subquery.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformSubquery(Transformer *this,PGSubLink *root)

{
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_00
  ;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::OrderModifier_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var5;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var6;
  _Head_base<0UL,_duckdb::FunctionExpression_*,_false> _Var7;
  undefined8 uVar8;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var9;
  _Head_base<0UL,_duckdb::OrderModifier_*,_false> _Var10;
  char cVar11;
  ExpressionType EVar12;
  bool bVar13;
  Transformer *pTVar14;
  pointer pSVar15;
  type pSVar16;
  SelectNode *this_01;
  pointer pSVar17;
  pointer pQVar18;
  StarExpression *pSVar19;
  pointer pSVar20;
  pointer pRVar21;
  pointer pFVar22;
  pointer pOVar23;
  pointer pPVar24;
  BaseExpression *this_02;
  ConstantExpression *pCVar25;
  idx_t index;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var26;
  undefined8 *puVar27;
  OperatorExpression *this_03;
  pointer pCVar28;
  pointer pSVar29;
  _Head_base<0UL,_duckdb::TableRef_*,_false> this_04;
  NotImplementedException *this_05;
  BinderException *this_06;
  ParserException *this_07;
  ulong uVar30;
  ulong *puVar31;
  long in_RDX;
  pointer this_08;
  char cVar32;
  pointer pOVar33;
  ulong __val;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  list_children;
  string operator_name;
  optional_ptr<duckdb::SelectNode,_true> sub_select;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  _Head_base<0UL,_duckdb::SubqueryExpression_*,_false> local_140;
  string local_138;
  _Head_base<0UL,_duckdb::FunctionExpression_*,_false> local_110;
  undefined1 local_108 [64];
  optional_ptr<duckdb::SelectNode,_true> local_c8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_c0;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_b8;
  _Head_base<0UL,_duckdb::CaseExpression_*,_false> local_b0;
  _Head_base<0UL,_duckdb::OrderModifier_*,_false> local_a8;
  LogicalType local_a0;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> local_88
  ;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_80;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> local_78
  ;
  pointer local_70;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_68;
  LogicalType local_48;
  
  pTVar14 = (Transformer *)operator_new(0x58);
  SubqueryExpression::SubqueryExpression((SubqueryExpression *)pTVar14);
  local_140._M_head_impl = (SubqueryExpression *)pTVar14;
  TransformSelectStmt((Transformer *)local_108,(PGNode *)root,
                      SUB81(*(undefined8 *)(in_RDX + 0x20),0));
  pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
            ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                          *)&local_140);
  uVar8 = local_108._0_8_;
  local_108._0_8_ = (Transformer *)0x0;
  _Var1._M_head_impl =
       (pSVar15->subquery).
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  (pSVar15->subquery).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)uVar8;
  if ((_Var1._M_head_impl != (SelectStatement *)0x0) &&
     ((**(code **)(*(long *)&(_Var1._M_head_impl)->super_SQLStatement + 8))(),
     (Transformer *)local_108._0_8_ != (Transformer *)0x0)) {
    (**(code **)(*(long *)local_108._0_8_ + 8))();
  }
  pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
            ::operator*((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                         *)&local_140);
  SetQueryLocation(&pSVar16->super_ParsedExpression,*(int *)(in_RDX + 0x28));
  switch(*(undefined4 *)(in_RDX + 4)) {
  case 0:
    pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    pSVar15->subquery_type = EXISTS;
    break;
  case 1:
  case 2:
    pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    pSVar15->subquery_type = ANY;
    TransformExpression((Transformer *)local_108,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    uVar8 = local_108._0_8_;
    local_108._0_8_ = (Transformer *)0x0;
    _Var26._M_head_impl =
         (pSVar15->child).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pSVar15->child).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)uVar8;
    if ((_Var26._M_head_impl != (ParsedExpression *)0x0) &&
       ((**(code **)(*(long *)&(_Var26._M_head_impl)->super_BaseExpression + 8))(),
       (Transformer *)local_108._0_8_ != (Transformer *)0x0)) {
      (**(code **)(*(long *)local_108._0_8_ + 8))();
    }
    if (*(long *)(in_RDX + 0x18) == 0) {
      pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)&local_140);
      pSVar15->comparison_type = COMPARE_BOUNDARY_START;
    }
    else {
      local_138._M_dataplus._M_p = (pointer)**(undefined8 **)(*(long *)(in_RDX + 0x18) + 8);
      optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_138);
      ::std::__cxx11::string::string
                ((string *)local_108,*(char **)(local_138._M_dataplus._M_p + 8),
                 (allocator *)&local_68);
      EVar12 = OperatorToExpressionType((string *)local_108);
      pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)&local_140);
      pSVar15->comparison_type = EVar12;
      if ((Transformer *)local_108._0_8_ != (Transformer *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_);
      }
    }
    pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    if ((((pSVar15->comparison_type != COMPARE_BOUNDARY_START) &&
         (pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                    ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                                  *)&local_140), pSVar15->comparison_type != COMPARE_NOTEQUAL)) &&
        (pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                   ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                                 *)&local_140), pSVar15->comparison_type != COMPARE_GREATERTHAN)) &&
       (((pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                    ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                                  *)&local_140),
         pSVar15->comparison_type != COMPARE_GREATERTHANOREQUALTO &&
         (pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                    ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                                  *)&local_140), pSVar15->comparison_type != COMPARE_LESSTHAN)) &&
        (pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                   ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                                 *)&local_140),
        pSVar15->comparison_type != COMPARE_LESSTHANOREQUALTO)))) {
      this_07 = (ParserException *)__cxa_allocate_exception(0x10);
      local_108._0_8_ = local_108 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,
                 "ANY and ALL operators require one of =,<>,>,<,>=,<= comparisons!","");
      ParserException::ParserException(this_07,(string *)local_108);
      __cxa_throw(this_07,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (*(int *)(in_RDX + 4) == 1) {
      pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)&local_140);
      EVar12 = NegateComparisonExpression(pSVar15->comparison_type);
      pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)&local_140);
      pSVar15->comparison_type = EVar12;
      pTVar14 = (Transformer *)operator_new(0x50);
      local_108._0_8_ = local_140._M_head_impl;
      local_140._M_head_impl = (SubqueryExpression *)0x0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      OperatorExpression::OperatorExpression
                ((OperatorExpression *)pTVar14,OPERATOR_NOT,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_108,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_138);
      if ((long *)local_138._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_138._M_dataplus._M_p + 8))();
      }
      local_138._M_dataplus._M_p = (pointer)0x0;
      if ((Transformer *)local_108._0_8_ != (Transformer *)0x0) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
      (this->parent).ptr = pTVar14;
      if (local_140._M_head_impl == (SubqueryExpression *)0x0) {
        return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                )this;
      }
      (*((local_140._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression
        [1])();
      return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              )this;
    }
    break;
  default:
    this_05 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_108._0_8_ = local_108 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"Subquery of type %d not implemented\n","");
    NotImplementedException::NotImplementedException<int>
              (this_05,(string *)local_108,*(int *)(in_RDX + 4));
    __cxa_throw(this_05,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 4:
    pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    pSVar15->subquery_type = SCALAR;
    break;
  case 6:
    this_01 = (SelectNode *)operator_new(0xf0);
    SelectNode::SelectNode(this_01);
    local_c0._M_head_impl = (ParsedExpression *)0x0;
    local_c8.ptr = (SelectNode *)0x0;
    local_b8._M_head_impl = this_01;
    pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    pSVar17 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->(&pSVar15->subquery);
    pQVar18 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
              operator->(&pSVar17->node);
    if (pQVar18->type == SELECT_NODE) {
      pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)&local_140);
      pSVar17 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                ::operator->(&pSVar15->subquery);
      pQVar18 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
                operator->(&pSVar17->node);
      local_c8.ptr = QueryNode::Cast<duckdb::SelectNode>(pQVar18);
      optional_ptr<duckdb::SelectNode,_true>::CheckValid(&local_c8);
      if ((long)((local_c8.ptr)->select_list).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)((local_c8.ptr)->select_list).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 8) {
        this_06 = (BinderException *)__cxa_allocate_exception(0x10);
        pSVar16 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                  ::operator*((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                               *)&local_140);
        local_108._0_8_ = local_108 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"Subquery returns %zu columns - expected 1","");
        optional_ptr<duckdb::SelectNode,_true>::CheckValid(&local_c8);
        BinderException::BinderException<unsigned_long>
                  (this_06,&pSVar16->super_ParsedExpression,(string *)local_108,
                   (long)((local_c8.ptr)->select_list).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)((local_c8.ptr)->select_list).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        __cxa_throw(this_06,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar19 = (StarExpression *)operator_new(0x40);
      PositionalReferenceExpression::PositionalReferenceExpression
                ((PositionalReferenceExpression *)pSVar19,1);
      _Var26._M_head_impl = local_c0._M_head_impl;
      local_c0._M_head_impl = (ParsedExpression *)pSVar19;
LAB_00e72d74:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var26._M_head_impl !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)_Var26._M_head_impl + 8))();
      }
    }
    else {
      pSVar19 = (StarExpression *)operator_new(0x110);
      local_108._8_8_ = (element_type *)0x0;
      local_108[0x10] = '\0';
      local_108._0_8_ = (Transformer *)(local_108 + 0x10);
      StarExpression::StarExpression(pSVar19,(string *)local_108);
      local_138._M_dataplus._M_p = (pointer)pSVar19;
      if ((Transformer *)local_108._0_8_ != (Transformer *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_);
      }
      pSVar20 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                              *)&local_138);
      _Var26._M_head_impl = local_c0._M_head_impl;
      local_c0._M_head_impl = (ParsedExpression *)local_138._M_dataplus._M_p;
      pSVar20->columns = true;
      local_138._M_dataplus._M_p = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var26._M_head_impl !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&(_Var26._M_head_impl)->super_BaseExpression)->_M_allocated_capacity + 8))
                  ();
        _Var26._M_head_impl = (ParsedExpression *)local_138._M_dataplus._M_p;
        goto LAB_00e72d74;
      }
    }
    local_68.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_68,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_c0);
    make_uniq<duckdb::FunctionExpression,char_const(&)[10],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_110,(char (*) [10])"array_agg",
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_68);
    pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    pSVar17 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->(&pSVar15->subquery);
    pQVar18 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
              operator->(&pSVar17->node);
    puVar2 = (pQVar18->modifiers).
             super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_08 = (pQVar18->modifiers).
                   super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_08 != puVar2;
        this_08 = this_08 + 1) {
      pRVar21 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                ::operator->(this_08);
      if (pRVar21->type == ORDER_MODIFIER) {
        pRVar21 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                  ::operator->(this_08);
        (*pRVar21->_vptr_ResultModifier[3])(&local_a8,pRVar21);
        _Var10._M_head_impl = local_a8._M_head_impl;
        local_a8._M_head_impl = (OrderModifier *)0x0;
        pFVar22 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                  ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                                *)&local_110);
        _Var3._M_head_impl =
             (pFVar22->order_bys).
             super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
             .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl;
        (pFVar22->order_bys).
        super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
        super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
        .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl = _Var10._M_head_impl;
        if (_Var3._M_head_impl != (OrderModifier *)0x0) {
          (**(code **)(*(long *)&(_Var3._M_head_impl)->super_ResultModifier + 8))();
        }
        if (local_a8._M_head_impl != (OrderModifier *)0x0) {
          (*((local_a8._M_head_impl)->super_ResultModifier)._vptr_ResultModifier[1])();
        }
        local_a8._M_head_impl = (OrderModifier *)0x0;
        break;
      }
    }
    local_78._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
         (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)this;
    pFVar22 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
              ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                            *)&local_110);
    if ((pFVar22->order_bys).
        super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
        super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
        .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl != (OrderModifier *)0x0)
    {
      pFVar22 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                              *)&local_110);
      pOVar23 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->(&pFVar22->order_bys);
      pOVar33 = (pOVar23->orders).
                super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_70 = (pOVar23->orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (pOVar33 != local_70) {
        __val = 0;
        do {
          this_00 = &pOVar33->expression;
          pPVar24 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(this_00);
          if ((pPVar24->super_BaseExpression).type == VALUE_CONSTANT) {
            this_02 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->(this_00)->super_BaseExpression;
            pCVar25 = BaseExpression::Cast<duckdb::ConstantExpression>(this_02);
            LogicalType::LogicalType(&local_48,SQLNULL);
            Value::Value((Value *)local_108,&local_48);
            LogicalType::~LogicalType(&local_48);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            local_138._M_string_length = 0;
            local_138.field_2._M_allocated_capacity =
                 local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
            LogicalType::LogicalType(&local_a0,BIGINT);
            bVar13 = Value::DefaultTryCastAs
                               (&pCVar25->value,&local_a0,(Value *)local_108,&local_138,false);
            LogicalType::~LogicalType(&local_a0);
            if (bVar13) {
              index = BigIntValue::Get((Value *)local_108);
              _Var26._M_head_impl = (ParsedExpression *)operator_new(0x40);
              if ((long)index < 0) {
                index = 0xffffffffffffffff;
              }
              PositionalReferenceExpression::PositionalReferenceExpression
                        ((PositionalReferenceExpression *)_Var26._M_head_impl,index);
              _Var4._M_head_impl =
                   (this_00->
                   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   )._M_t.
                   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
              (this_00->
              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                   _Var26._M_head_impl;
              if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
                (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
            Value::~Value((Value *)local_108);
          }
          else if (local_c8.ptr == (SelectNode *)0x0) {
            RemoveOrderQualificationRecursive(this_00);
          }
          else {
            __val = __val + 1;
            cVar32 = '\x01';
            if (9 < __val) {
              uVar30 = __val;
              cVar11 = '\x04';
              do {
                cVar32 = cVar11;
                if (uVar30 < 100) {
                  cVar32 = cVar32 + -2;
                  goto LAB_00e73049;
                }
                if (uVar30 < 1000) {
                  cVar32 = cVar32 + -1;
                  goto LAB_00e73049;
                }
                if (uVar30 < 10000) goto LAB_00e73049;
                bVar13 = 99999 < uVar30;
                uVar30 = uVar30 / 10000;
                cVar11 = cVar32 + '\x04';
              } while (bVar13);
              cVar32 = cVar32 + '\x01';
            }
LAB_00e73049:
            local_108._0_8_ = local_108 + 0x10;
            ::std::__cxx11::string::_M_construct((ulong)local_108,cVar32);
            ::std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_108._0_8_,local_108._8_4_,__val);
            puVar27 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)local_108,0,(char *)0x0,0x1d9a896);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            puVar31 = puVar27 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar27 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar31) {
              local_138.field_2._M_allocated_capacity = *puVar31;
              local_138.field_2._8_8_ = puVar27[3];
            }
            else {
              local_138.field_2._M_allocated_capacity = *puVar31;
              local_138._M_dataplus._M_p = (pointer)*puVar27;
            }
            local_138._M_string_length = puVar27[1];
            *puVar27 = puVar31;
            puVar27[1] = 0;
            *(undefined1 *)(puVar27 + 2) = 0;
            if ((Transformer *)local_108._0_8_ != (Transformer *)(local_108 + 0x10)) {
              operator_delete((void *)local_108._0_8_);
            }
            pPVar24 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->(this_00);
            ::std::__cxx11::string::_M_assign((string *)&(pPVar24->super_BaseExpression).alias);
            optional_ptr<duckdb::SelectNode,_true>::CheckValid(&local_c8);
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)&(local_c8.ptr)->select_list,this_00);
            _Var26._M_head_impl = (ParsedExpression *)operator_new(0x50);
            local_108._0_8_ = local_108 + 0x10;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_108,local_138._M_dataplus._M_p,
                       local_138._M_dataplus._M_p + local_138._M_string_length);
            ColumnRefExpression::ColumnRefExpression
                      ((ColumnRefExpression *)_Var26._M_head_impl,(string *)local_108);
            if ((Transformer *)local_108._0_8_ != (Transformer *)(local_108 + 0x10)) {
              operator_delete((void *)local_108._0_8_);
            }
            _Var4._M_head_impl =
                 (this_00->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (this_00->
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 _Var26._M_head_impl;
            if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
              (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
          }
          pOVar33 = pOVar33 + 1;
        } while (pOVar33 != local_70);
      }
    }
    pFVar22 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
              ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                            *)&local_110);
    (*(pFVar22->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[0xc])
              ((__node_base *)&local_a0,pFVar22);
    this_03 = (OperatorExpression *)operator_new(0x50);
    local_108[0] = local_a0.id_;
    local_108[1] = local_a0.physical_type_;
    local_108._2_6_ = local_a0._2_6_;
    local_a0._0_8_ = (_Hash_node_base *)0x0;
    local_138._M_dataplus._M_p = (pointer)0x0;
    OperatorExpression::OperatorExpression
              (this_03,OPERATOR_IS_NULL,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_108,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_138);
    this = (Transformer *)
           local_78._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    if ((long *)local_138._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_138._M_dataplus._M_p + 8))();
    }
    local_138._M_dataplus._M_p = (pointer)0x0;
    if ((Transformer *)local_108._0_8_ != (Transformer *)0x0) {
      (**(code **)(*(long *)local_108._0_8_ + 8))();
    }
    if ((_Hash_node_base *)local_a0._0_8_ != (_Hash_node_base *)0x0) {
      (*(code *)(*(_Hash_node_base **)local_a0._0_8_)[1]._M_nxt)();
    }
    local_138._M_dataplus._M_p = (pointer)0x0;
    local_138._M_string_length = 0;
    local_138.field_2._M_allocated_capacity = 0;
    make_uniq<duckdb::FunctionExpression,char_const(&)[11],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_88,(char (*) [11])"list_value",
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_138);
    pTVar14 = (Transformer *)operator_new(0x58);
    CaseExpression::CaseExpression((CaseExpression *)pTVar14);
    local_a0.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_88._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    local_88._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )0x0;
    local_b0._M_head_impl = (CaseExpression *)pTVar14;
    local_a0._0_8_ = this_03;
    pCVar28 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
              ::operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                            *)&local_b0);
    ::std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>::
    emplace_back<duckdb::CaseCheck>
              (&(pCVar28->case_checks).
                super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>,
               (CaseCheck *)&local_a0);
    _Var7._M_head_impl = local_110._M_head_impl;
    local_110._M_head_impl = (FunctionExpression *)0x0;
    pCVar28 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
              ::operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                            *)&local_b0);
    _Var26._M_head_impl =
         (pCVar28->else_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar28->else_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         &(_Var7._M_head_impl)->super_ParsedExpression;
    if (_Var26._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var26._M_head_impl)->super_BaseExpression + 8))();
    }
    pSVar29 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_b8);
    local_108._0_8_ = local_b0._M_head_impl;
    local_b0._M_head_impl = (CaseExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar29->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_108);
    if ((Transformer *)local_108._0_8_ != (Transformer *)0x0) {
      (**(code **)(*(long *)local_108._0_8_ + 8))();
    }
    pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    this_04._M_head_impl = (TableRef *)operator_new(0x70);
    local_80._M_head_impl =
         (pSVar15->subquery).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pSVar15->subquery).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)0x0;
    local_108._8_8_ = (element_type *)0x0;
    local_108[0x10] = '\0';
    local_108._0_8_ = (Transformer *)(local_108 + 0x10);
    SubqueryRef::SubqueryRef
              ((SubqueryRef *)this_04._M_head_impl,
               (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                *)&local_80,(string *)local_108);
    if ((Transformer *)local_108._0_8_ != (Transformer *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_);
    }
    if (local_80._M_head_impl != (SelectStatement *)0x0) {
      (*((local_80._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
    }
    pSVar29 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_b8);
    _Var5._M_head_impl =
         (pSVar29->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar29->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
    ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = this_04._M_head_impl;
    if (_Var5._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var5._M_head_impl)->_vptr_TableRef + 8))();
    }
    local_108._0_8_ = operator_new(0x80);
    _Var9._M_head_impl = local_b8._M_head_impl;
    *(StatementType *)&((Transformer *)local_108._0_8_)->options = SELECT_STATEMENT;
    ((Transformer *)local_108._0_8_)->prepared_statement_parameter_index = 0;
    (((Transformer *)local_108._0_8_)->named_param_map)._M_h._M_buckets = (__buckets_ptr)0x0;
    (((case_insensitive_map_t<idx_t> *)
     &(((Transformer *)local_108._0_8_)->named_param_map)._M_h._M_bucket_count)->_M_h)._M_buckets =
         (__buckets_ptr)&((Transformer *)local_108._0_8_)->last_param_type;
    (((Transformer *)local_108._0_8_)->named_param_map)._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)0x1;
    ((__node_base *)&(((Transformer *)local_108._0_8_)->named_param_map)._M_h._M_element_count)->
    _M_nxt = (_Hash_node_base *)0x0;
    *(size_type *)
     &(((Transformer *)local_108._0_8_)->named_param_map)._M_h._M_rehash_policy._M_max_load_factor =
         0;
    ((_Prime_rehash_policy *)
    &(((Transformer *)local_108._0_8_)->named_param_map)._M_h._M_rehash_policy._M_next_resize)->
    _M_max_load_factor = 1.0;
    (((Transformer *)local_108._0_8_)->named_param_map)._M_h._M_single_bucket = (__node_base_ptr)0x0
    ;
    *(__node_base_ptr *)&((Transformer *)local_108._0_8_)->last_param_type = (__node_base_ptr)0x0;
    (((Transformer *)local_108._0_8_)->window_clauses)._M_h._M_buckets =
         (__buckets_ptr)&(((Transformer *)local_108._0_8_)->window_clauses)._M_h._M_before_begin;
    (((Transformer *)local_108._0_8_)->window_clauses)._M_h._M_bucket_count = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&(((Transformer *)local_108._0_8_)->window_clauses)._M_h._M_before_begin)->_M_local_buf[0] =
         '\0';
    ((SQLStatement *)&((Transformer *)local_108._0_8_)->parent)->_vptr_SQLStatement =
         (_func_int **)&PTR__SelectStatement_02442ad0;
    *(undefined8 *)&(((Transformer *)local_108._0_8_)->window_clauses)._M_h._M_rehash_policy = 0;
    local_b8._M_head_impl = (SelectNode *)0x0;
    pSVar17 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                            *)local_108);
    _Var6._M_head_impl =
         (pSVar17->node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar17->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
         &(_Var9._M_head_impl)->super_QueryNode;
    if (_Var6._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var6._M_head_impl)->_vptr_QueryNode + 8))();
    }
    pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    uVar8 = local_108._0_8_;
    local_108._0_8_ = (Transformer *)0x0;
    _Var1._M_head_impl =
         (pSVar15->subquery).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pSVar15->subquery).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)uVar8
    ;
    if (_Var1._M_head_impl != (SelectStatement *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_SQLStatement + 8))();
    }
    pSVar15 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)&local_140);
    pSVar15->subquery_type = SCALAR;
    if ((Transformer *)local_108._0_8_ != (Transformer *)0x0) {
      (**(code **)(*(long *)local_108._0_8_ + 8))();
    }
    if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )local_a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (ParsedExpression *)0x0) {
      (*(local_a0.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_ExtraTypeInfo[1])();
    }
    local_a0.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    if ((OperatorExpression *)local_a0._0_8_ != (OperatorExpression *)0x0) {
      (*(((ParsedExpression *)local_a0._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    if (local_b0._M_head_impl != (CaseExpression *)0x0) {
      (*(code *)((__node_base_ptr)
                ((local_b0._M_head_impl)->super_ParsedExpression).super_BaseExpression.
                _vptr_BaseExpression)[1]._M_nxt)();
    }
    if (local_88._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )0x0) {
      (**(code **)(*(long *)local_88._M_t.
                            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl +
                  8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)&local_138);
    if (local_110._M_head_impl != (FunctionExpression *)0x0) {
      (*((local_110._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression
        [1])();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_68);
    if ((StarExpression *)local_c0._M_head_impl != (StarExpression *)0x0) {
      (*((BaseExpression *)&((local_c0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    if (local_b8._M_head_impl != (SelectNode *)0x0) {
      (*((local_b8._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
    }
  }
  *(SubqueryExpression **)this = local_140._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformSubquery(duckdb_libpgquery::PGSubLink &root) {
	auto subquery_expr = make_uniq<SubqueryExpression>();

	subquery_expr->subquery = TransformSelectStmt(*root.subselect);
	SetQueryLocation(*subquery_expr, root.location);
	D_ASSERT(subquery_expr->subquery);
	D_ASSERT(!subquery_expr->subquery->node->GetSelectList().empty());

	switch (root.subLinkType) {
	case duckdb_libpgquery::PG_EXISTS_SUBLINK: {
		subquery_expr->subquery_type = SubqueryType::EXISTS;
		break;
	}
	case duckdb_libpgquery::PG_ANY_SUBLINK:
	case duckdb_libpgquery::PG_ALL_SUBLINK: {
		// comparison with ANY() or ALL()
		subquery_expr->subquery_type = SubqueryType::ANY;
		subquery_expr->child = TransformExpression(root.testexpr);
		// get the operator name
		if (!root.operName) {
			// simple IN
			subquery_expr->comparison_type = ExpressionType::COMPARE_EQUAL;
		} else {
			auto operator_name =
			    string((PGPointerCast<duckdb_libpgquery::PGValue>(root.operName->head->data.ptr_value))->val.str);
			subquery_expr->comparison_type = OperatorToExpressionType(operator_name);
		}
		if (subquery_expr->comparison_type != ExpressionType::COMPARE_EQUAL &&
		    subquery_expr->comparison_type != ExpressionType::COMPARE_NOTEQUAL &&
		    subquery_expr->comparison_type != ExpressionType::COMPARE_GREATERTHAN &&
		    subquery_expr->comparison_type != ExpressionType::COMPARE_GREATERTHANOREQUALTO &&
		    subquery_expr->comparison_type != ExpressionType::COMPARE_LESSTHAN &&
		    subquery_expr->comparison_type != ExpressionType::COMPARE_LESSTHANOREQUALTO) {
			throw ParserException("ANY and ALL operators require one of =,<>,>,<,>=,<= comparisons!");
		}
		if (root.subLinkType == duckdb_libpgquery::PG_ALL_SUBLINK) {
			// ALL sublink is equivalent to NOT(ANY) with inverted comparison
			// e.g. [= ALL()] is equivalent to [NOT(<> ANY())]
			// first invert the comparison type
			subquery_expr->comparison_type = NegateComparisonExpression(subquery_expr->comparison_type);
			return make_uniq<OperatorExpression>(ExpressionType::OPERATOR_NOT, std::move(subquery_expr));
		}
		break;
	}
	case duckdb_libpgquery::PG_EXPR_SUBLINK: {
		// return a single scalar value from the subquery
		// no child expression to compare to
		subquery_expr->subquery_type = SubqueryType::SCALAR;
		break;
	}
	case duckdb_libpgquery::PG_ARRAY_SUBLINK: {
		// ARRAY expression
		// wrap subquery into
		// "SELECT CASE WHEN ARRAY_AGG(col) IS NULL THEN [] ELSE ARRAY_AGG(col) END FROM (...) tbl"
		auto select_node = make_uniq<SelectNode>();

		unique_ptr<ParsedExpression> array_agg_child;
		optional_ptr<SelectNode> sub_select;
		if (subquery_expr->subquery->node->type == QueryNodeType::SELECT_NODE) {
			// easy case - subquery is a SELECT
			sub_select = subquery_expr->subquery->node->Cast<SelectNode>();
			if (sub_select->select_list.size() != 1) {
				throw BinderException(*subquery_expr, "Subquery returns %zu columns - expected 1",
				                      sub_select->select_list.size());
			}
			array_agg_child = make_uniq<PositionalReferenceExpression>(1ULL);
		} else {
			// subquery is not a SELECT but a UNION or CTE
			// we can still support this but it is more challenging since we can't push columns for the ORDER BY
			auto columns_star = make_uniq<StarExpression>();
			columns_star->columns = true;
			array_agg_child = std::move(columns_star);
		}

		// ARRAY_AGG(COLUMNS(*))
		vector<unique_ptr<ParsedExpression>> children;
		children.push_back(std::move(array_agg_child));
		auto aggr = make_uniq<FunctionExpression>("array_agg", std::move(children));
		// push ORDER BY modifiers into the array_agg
		for (auto &modifier : subquery_expr->subquery->node->modifiers) {
			if (modifier->type == ResultModifierType::ORDER_MODIFIER) {
				aggr->order_bys = unique_ptr_cast<ResultModifier, OrderModifier>(modifier->Copy());
				break;
			}
		}
		// transform constants (e.g. ORDER BY 1) into positional references (ORDER BY #1)
		idx_t array_idx = 0;
		if (aggr->order_bys) {
			for (auto &order : aggr->order_bys->orders) {
				if (order.expression->GetExpressionType() == ExpressionType::VALUE_CONSTANT) {
					auto &constant_expr = order.expression->Cast<ConstantExpression>();
					Value bigint_value;
					string error;
					if (constant_expr.value.DefaultTryCastAs(LogicalType::BIGINT, bigint_value, &error)) {
						int64_t order_index = BigIntValue::Get(bigint_value);
						idx_t positional_index = order_index < 0 ? NumericLimits<idx_t>::Maximum() : idx_t(order_index);
						order.expression = make_uniq<PositionalReferenceExpression>(positional_index);
					}
				} else if (sub_select) {
					// if we have a SELECT we can push the ORDER BY clause into the SELECT list and reference it
					auto alias = "__array_internal_idx_" + to_string(++array_idx);
					order.expression->alias = alias;
					sub_select->select_list.push_back(std::move(order.expression));
					order.expression = make_uniq<ColumnRefExpression>(alias);
				} else {
					// otherwise we remove order qualifications
					RemoveOrderQualificationRecursive(order.expression);
				}
			}
		}
		// ARRAY_AGG(COLUMNS(*)) IS NULL
		auto agg_is_null = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_IS_NULL, aggr->Copy());
		// empty list
		vector<unique_ptr<ParsedExpression>> list_children;
		auto empty_list = make_uniq<FunctionExpression>("list_value", std::move(list_children));
		// CASE
		auto case_expr = make_uniq<CaseExpression>();
		CaseCheck check;
		check.when_expr = std::move(agg_is_null);
		check.then_expr = std::move(empty_list);
		case_expr->case_checks.push_back(std::move(check));
		case_expr->else_expr = std::move(aggr);

		select_node->select_list.push_back(std::move(case_expr));

		// FROM (...) tbl
		auto child_subquery = make_uniq<SubqueryRef>(std::move(subquery_expr->subquery));
		select_node->from_table = std::move(child_subquery);

		auto new_subquery = make_uniq<SelectStatement>();
		new_subquery->node = std::move(select_node);
		subquery_expr->subquery = std::move(new_subquery);

		subquery_expr->subquery_type = SubqueryType::SCALAR;
		break;
	}
	default:
		throw NotImplementedException("Subquery of type %d not implemented\n", (int)root.subLinkType);
	}
	return std::move(subquery_expr);
}